

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

bool __thiscall QHttp2Configuration::isEqual(QHttp2Configuration *this,QHttp2Configuration *other)

{
  QHttp2ConfigurationPrivate *pQVar1;
  QHttp2ConfigurationPrivate *pQVar2;
  
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    return true;
  }
  if ((((pQVar2->pushEnabled == pQVar1->pushEnabled) &&
       (pQVar2->huffmanCompressionEnabled == pQVar1->huffmanCompressionEnabled)) &&
      (pQVar2->sessionWindowSize == pQVar1->sessionWindowSize)) &&
     (pQVar2->streamWindowSize == pQVar1->streamWindowSize)) {
    return pQVar2->maxConcurrentStreams == pQVar1->maxConcurrentStreams;
  }
  return false;
}

Assistant:

constexpr P get() const noexcept { return ptr; }